

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.h
# Opt level: O0

void __thiscall KDIS::KDataStream::Read<unsigned_int>(KDataStream *this,uint *T)

{
  reference pvVar1;
  byte local_1d;
  uint local_1c;
  KUINT8 i;
  uint *puStack_18;
  NetToDataType<unsigned_int> OctArray;
  uint *T_local;
  KDataStream *this_local;
  
  puStack_18 = T;
  T_local = &this->m_MachineEndian;
  NetToDataType<unsigned_int>::NetToDataType((NetToDataType<unsigned_int> *)&local_1c,*T,false);
  local_1d = 0;
  while (local_1d < 4) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_vBuffer,(ulong)this->m_ui16CurrentWritePos);
    *(value_type *)((long)&local_1c + (ulong)local_1d) = *pvVar1;
    local_1d = local_1d + 1;
    this->m_ui16CurrentWritePos = this->m_ui16CurrentWritePos + 1;
  }
  if (this->m_MachineEndian != this->m_NetEndian) {
    NetToDataType<unsigned_int>::SwapBytes((NetToDataType<unsigned_int> *)&local_1c);
  }
  *puStack_18 = local_1c;
  return;
}

Assistant:

void KDataStream::Read( Type & T )
{
    NetToDataType<Type> OctArray( T, false );

    // Copy octets into data type
    for( KUINT8 i = 0; i < sizeof T; ++i, ++m_ui16CurrentWritePos )
    {
        OctArray.m_Octs[i] = m_vBuffer[m_ui16CurrentWritePos];
    }

    if( m_MachineEndian != m_NetEndian )
    {
        OctArray.SwapBytes();
    }

    T = OctArray.m_Value;
}